

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

int cpu_x86_get_descr_debug_x86_64
              (CPUX86State *env,uint selector,target_ulong *base,uint *limit,uint *flags)

{
  int iVar1;
  uint local_58;
  int index;
  uint32_t e2;
  uint32_t e1;
  target_ulong ptr;
  SegmentCache *dt;
  CPUState *cs;
  uint *flags_local;
  uint *limit_local;
  target_ulong *base_local;
  CPUX86State *pCStack_18;
  uint selector_local;
  CPUX86State *env_local;
  
  cs = (CPUState *)flags;
  flags_local = limit;
  limit_local = (uint *)base;
  base_local._4_4_ = selector;
  pCStack_18 = env;
  dt = (SegmentCache *)env_cpu(env);
  if ((base_local._4_4_ & 4) == 0) {
    ptr = (target_ulong)&pCStack_18->gdt;
  }
  else {
    ptr = (target_ulong)&pCStack_18->ldt;
  }
  _e2 = *(long *)(ptr + 8) + (long)(int)(base_local._4_4_ & 0xfffffff8);
  if ((((base_local._4_4_ & 0xfffffff8) + 7 <= *(uint *)(ptr + 0x10)) &&
      (iVar1 = cpu_memory_rw_debug_x86_64((CPUState *)dt,_e2,&index,4,false), iVar1 == 0)) &&
     (iVar1 = cpu_memory_rw_debug_x86_64((CPUState *)dt,_e2 + 4,&local_58,4,false), iVar1 == 0)) {
    *(ulong *)limit_local =
         (ulong)((uint)index >> 0x10 | (local_58 & 0xff) << 0x10 | local_58 & 0xff000000);
    *flags_local = index & 0xffffU | local_58 & 0xf0000;
    if ((local_58 & 0x800000) != 0) {
      *flags_local = *flags_local << 0xc | 0xfff;
    }
    cs->nr_cores = local_58;
    return 1;
  }
  return 0;
}

Assistant:

int cpu_x86_get_descr_debug(CPUX86State *env, unsigned int selector,
                            target_ulong *base, unsigned int *limit,
                            unsigned int *flags)
{
    CPUState *cs = env_cpu(env);
    SegmentCache *dt;
    target_ulong ptr;
    uint32_t e1, e2;
    int index;

    if (selector & 0x4)
        dt = &env->ldt;
    else
        dt = &env->gdt;
    index = selector & ~7;
    ptr = dt->base + index;
    if ((index + 7) > dt->limit
        || cpu_memory_rw_debug(cs, ptr, (uint8_t *)&e1, sizeof(e1), 0) != 0
        || cpu_memory_rw_debug(cs, ptr+4, (uint8_t *)&e2, sizeof(e2), 0) != 0)
        return 0;

    *base = ((e1 >> 16) | ((e2 & 0xff) << 16) | (e2 & 0xff000000));
    *limit = (e1 & 0xffff) | (e2 & 0x000f0000);
    if (e2 & DESC_G_MASK)
        *limit = (*limit << 12) | 0xfff;
    *flags = e2;

    return 1;
}